

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::clara::detail::Help::Help(Help *this,bool *showHelpFlag)

{
  Opt *pOVar1;
  anon_class_8_1_beab0a68_for_m_lambda *in_RDI;
  string *in_stack_fffffffffffffee8;
  Opt *in_stack_fffffffffffffef0;
  allocator<char> *in_stack_ffffffffffffff20;
  Opt *in_stack_ffffffffffffff30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  allocator<char> local_c1;
  string local_c0 [39];
  allocator<char> local_99;
  string local_98 [39];
  allocator<char> local_71;
  string local_70 [55];
  undefined1 local_39 [57];
  
  Opt::Opt<Catch::clara::detail::Help::Help(bool&)::_lambda(bool)_1_>
            (in_stack_ffffffffffffff30,in_RDI);
  in_RDI->showHelpFlag = (bool *)&PTR__Help_0038c1e8;
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_39;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            (this_00,(char *)in_RDI,in_stack_ffffffffffffff20);
  pOVar1 = ParserRefImpl<Catch::clara::detail::Opt>::operator()
                     (&in_stack_fffffffffffffef0->super_ParserRefImpl<Catch::clara::detail::Opt>,
                      in_stack_fffffffffffffee8);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            (this_00,(char *)in_RDI,(allocator<char> *)pOVar1);
  Opt::operator[](in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            (this_00,(char *)in_RDI,(allocator<char> *)pOVar1);
  Opt::operator[](in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            (this_00,(char *)in_RDI,(allocator<char> *)pOVar1);
  pOVar1 = Opt::operator[](in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  ParserRefImpl<Catch::clara::detail::Opt>::optional
            (&pOVar1->super_ParserRefImpl<Catch::clara::detail::Opt>);
  ::std::__cxx11::string::~string(local_c0);
  ::std::allocator<char>::~allocator(&local_c1);
  ::std::__cxx11::string::~string(local_98);
  ::std::allocator<char>::~allocator(&local_99);
  ::std::__cxx11::string::~string(local_70);
  ::std::allocator<char>::~allocator(&local_71);
  ::std::__cxx11::string::~string((string *)(local_39 + 1));
  ::std::allocator<char>::~allocator((allocator<char> *)local_39);
  return;
}

Assistant:

Help( bool &showHelpFlag )
        :   Opt([&]( bool flag ) {
                showHelpFlag = flag;
                return ParserResult::ok( ParseResultType::ShortCircuitAll );
            })
        {
            static_cast<Opt &>( *this )
                    ("display usage information")
                    ["-?"]["-h"]["--help"]
                    .optional();
        }